

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

void ImVector_ImDrawVert_resizeT(ImVector_ImDrawVert *self,int new_size,ImDrawVert v)

{
  ImVector<ImDrawVert>::resize(self,new_size,&v);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImDrawVert_resizeT(ImVector_ImDrawVert* self,int new_size,const ImDrawVert v)
{
    return self->resize(new_size,v);
}